

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O2

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  pre_constraint_order *arg1;
  double dVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pfVar8;
  pointer poVar9;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __first;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last;
  operator_type op;
  int *piVar10;
  pointer pmVar11;
  int iVar12;
  merged_constraint *cst;
  pointer pmVar13;
  pointer poVar14;
  size_t size;
  pointer ppVar15;
  pointer pfVar16;
  tuple<double,_baryonyx::show_size_type> *mem;
  operator_type oVar17;
  ulong uVar18;
  long lVar19;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __i;
  pointer ppVar20;
  long lVar21;
  pointer pmVar22;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __i_3;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *this;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  allocator_type local_e9;
  vector<double,_std::allocator<double>_> variable_cost;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_c0;
  vector<int,_std::allocator<int>_> variable_constraint_degree;
  __node_base_ptr p_Stack_78;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> constraints_ratio_min;
  baryonyx local_40 [16];
  
  arg1 = &(ctx->parameters).pre_order;
  info<baryonyx::solver_parameters::pre_constraint_order>
            (ctx,"  - merge constraint according to the `{}` algorithm\n",arg1);
  pcVar2 = (pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar3 = (pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar4 = (pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar6 = (pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = (pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar12 = (int)(((long)pcVar3 - (long)pcVar7) / 0x30) +
           (int)(((long)pcVar5 - (long)pcVar6) / 0x30) + (int)(((long)pcVar2 - (long)pcVar4) / 0x30)
  ;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,(long)iVar12);
  switch(*arg1) {
  case none:
    make_unsorted_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)&variable_constraint_degree,ctx,pb);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::_M_move_assign(__return_storage_ptr__,
                     (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)&variable_constraint_degree);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)&variable_constraint_degree);
    break;
  case memory:
    make_unsorted_merged_constraints
              ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)&variable_constraint_degree,ctx,pb);
    this = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)&variable_constraint_degree;
    goto LAB_00549894;
  case less_greater_equal:
  case less_equal_greater:
  case greater_less_equal:
  case greater_equal_less:
  case equal_less_greater:
  case equal_greater_less:
    variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&p_Stack_78;
    variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Stack_78 = (__node_base_ptr)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::reserve((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)&variable_cost,
              ((long)(pb->equal_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x30 +
              ((long)(pb->less_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x30 +
              ((long)(pb->greater_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x30);
    switch(*arg1) {
    case less_greater_equal:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,less,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      op = greater;
      break;
    case less_equal_greater:
      oVar17 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,less,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      goto LAB_0054981f;
    case greater_less_equal:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,greater,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      op = less;
      break;
    case greater_equal_less:
      oVar17 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,greater,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      goto LAB_00549854;
    case equal_less_greater:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,equal,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      oVar17 = less;
LAB_0054981f:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,oVar17,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      oVar17 = greater;
      goto LAB_0054986e;
    case equal_greater_less:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,equal,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      oVar17 = greater;
LAB_00549854:
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)&variable_constraint_degree,oVar17,pb,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)&variable_cost);
      oVar17 = less;
      goto LAB_0054986e;
    default:
      goto switchD_005494ba_default;
    }
    oVar17 = equal;
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)&variable_constraint_degree,op,pb,
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)&variable_cost);
LAB_0054986e:
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)&variable_constraint_degree,oVar17,pb,
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)&variable_cost);
switchD_005494ba_default:
    std::
    _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&variable_constraint_degree);
    this = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *)&variable_cost;
LAB_00549894:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::_M_move_assign(__return_storage_ptr__,this);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(this);
    improve_memory_usage(__return_storage_ptr__);
    break;
  case p1:
  case p2:
  case p3:
  case p4:
    make_unsorted_merged_constraints(&local_c0,ctx,pb);
    variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&variable_constraint_degree,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->vars).values.
                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc,
               (value_type_conflict1 *)&variable_cost,(allocator_type *)&constraints_ratio_min);
    for (pmVar13 = local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pmVar13 !=
        local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish; pmVar13 = pmVar13 + 1) {
      pfVar8 = (pmVar13->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pfVar16 = (pmVar13->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pfVar16 != pfVar8;
          pfVar16 = pfVar16 + 1) {
        variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[pfVar16->variable_index] =
             variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[pfVar16->variable_index] + 1;
      }
    }
    constraints_ratio_min.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&variable_cost,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->vars).values.
                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc,
               (value_type_conflict2 *)&constraints_ratio_min,&local_e9);
    poVar9 = (pb->objective).elements.
             super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (poVar14 = (pb->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start; poVar14 != poVar9;
        poVar14 = poVar14 + 1) {
      variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[poVar14->variable_index] =
           poVar14->factor /
           (double)variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[poVar14->variable_index];
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&constraints_ratio_min,
               ((long)local_c0.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c0.
                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28,(allocator_type *)&local_e9);
    ppVar15 = constraints_ratio_min.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar18 = 0;
        uVar18 != (((long)local_c0.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c0.
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28 & 0xffffffffU);
        uVar18 = uVar18 + 1) {
      pfVar16 = local_c0.
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].elements.
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar1 = variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pfVar16->variable_index];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar1;
      constraints_ratio_min.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18].first = (int)uVar18;
      constraints_ratio_min.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18].second = dVar1;
      lVar19 = 0;
      pfVar8 = local_c0.
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].elements.
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (((ulong)((long)pfVar8 - (long)pfVar16) >> 3 & 0xffffffff) - 1 != lVar19) {
        lVar21 = lVar19 + 1;
        lVar19 = lVar19 + 1;
        auVar24._8_8_ = 0;
        auVar24._0_8_ =
             variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[pfVar16[lVar21].variable_index];
        auVar23 = vminsd_avx(auVar24,auVar23);
        constraints_ratio_min.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar18].second = auVar23._0_8_;
      }
    }
    if (*arg1 == p1) {
      if (constraints_ratio_min.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          constraints_ratio_min.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar19 = (long)constraints_ratio_min.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)constraints_ratio_min.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                  (constraints_ratio_min.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   constraints_ratio_min.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar19 >> 4) * 2 ^ 0x7e);
        if (lVar19 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar15);
        }
        else {
          ppVar20 = ppVar15 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar15);
          for (; ppVar20 !=
                 constraints_ratio_min.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; ppVar20 = ppVar20 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                      (ppVar20);
          }
        }
      }
    }
    else if (constraints_ratio_min.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             constraints_ratio_min.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
      lVar19 = (long)constraints_ratio_min.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)constraints_ratio_min.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                (constraints_ratio_min.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 constraints_ratio_min.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar19 >> 4) * 2 ^ 0x7e);
      if (lVar19 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar15);
      }
      else {
        ppVar20 = ppVar15 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar15);
        for (; ppVar20 !=
               constraints_ratio_min.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish; ppVar20 = ppVar20 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                    (ppVar20);
        }
      }
    }
    pmVar11 = local_c0.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pmVar13 = local_c0.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar21 = (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = lVar21 / 0x28;
    ppVar15 = constraints_ratio_min.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar19 = 0; (uVar18 & 0xffffffff) * 0x28 - lVar19 != 0; lVar19 = lVar19 + 0x28) {
      piVar10 = &ppVar15->first;
      ppVar15 = ppVar15 + 1;
      *(int *)((long)&(local_c0.
                       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                       ._M_impl.super__Vector_impl_data._M_start)->id + lVar19) = *piVar10;
    }
    if (local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                (local_c0.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c0.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(uVar18) * 2 ^ 0x7e);
      if (lVar21 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar13,pmVar11);
      }
      else {
        pmVar22 = pmVar13 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar13,pmVar22);
        for (; pmVar22 != pmVar11; pmVar22 = pmVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                    (pmVar22);
        }
      }
    }
    lVar19 = (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    for (uVar18 = 0; uVar18 != (lVar19 / 0x28 & 0xffffffffU); uVar18 = uVar18 + 1) {
      __first._M_current =
           local_c0.
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar18].elements.
           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           local_c0.
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar18].elements.
           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                  (__first,__last,
                   (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >>
                                              3) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                    )&variable_cost);
        if ((long)__last._M_current - (long)__first._M_current < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                    (__first,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                      )&variable_cost);
        }
        else {
          __last_00._M_current = __first._M_current + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                    (__first,__last_00,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                      )&variable_cost);
          for (; __last_00._M_current != __last._M_current;
              __last_00._M_current = __last_00._M_current + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                      (__last_00,
                       (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                        )&variable_cost);
          }
        }
      }
    }
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&constraints_ratio_min.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&variable_cost.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&variable_constraint_degree.super__Vector_base<int,_std::allocator<int>_>);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::_M_move_assign(__return_storage_ptr__,&local_c0);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_c0);
  }
  variable_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(variable_cost.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)(((long)(__return_storage_ptr__->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(__return_storage_ptr__->
                                           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                           )._M_impl.super__Vector_impl_data._M_start) / -0x28) +
                               iVar12);
  size = memory_consumed(pb);
  memory_consumed_size<unsigned_long>(size);
  to_string_abi_cxx11_((string *)&variable_constraint_degree,local_40,mem);
  info<int,std::__cxx11::string>
            (ctx,"  - merged constraints removed: {}\n  - problem memory used: {}\n",
             (int *)&variable_cost,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &variable_constraint_degree);
  std::__cxx11::string::~string((string *)&variable_constraint_degree);
  return __return_storage_ptr__;
}

Assistant:

std::vector<merged_constraint>
make_merged_constraints(const context& ctx, const problem& pb)
{
    info(ctx,
         "  - merge constraint according to the `{}` algorithm\n",
         ctx.parameters.pre_order);

    auto original_nb = static_cast<int>(pb.equal_constraints.size() +
                                        pb.less_constraints.size() +
                                        pb.greater_constraints.size());

    std::vector<merged_constraint> ret;
    ret.reserve(original_nb);

    switch (ctx.parameters.pre_order) {
    case solver_parameters::pre_constraint_order::none:
        ret = make_unsorted_merged_constraints(ctx, pb);
        break;
    case solver_parameters::pre_constraint_order::memory:
        ret = make_unsorted_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::less_greater_equal:
    case solver_parameters::pre_constraint_order::less_equal_greater:
    case solver_parameters::pre_constraint_order::greater_less_equal:
    case solver_parameters::pre_constraint_order::greater_equal_less:
    case solver_parameters::pre_constraint_order::equal_less_greater:
    case solver_parameters::pre_constraint_order::equal_greater_less:
        ret = make_ordered_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::p1:
    case solver_parameters::pre_constraint_order::p2:
    case solver_parameters::pre_constraint_order::p3:
    case solver_parameters::pre_constraint_order::p4:
        ret = make_special_merged_constraints(ctx, pb);
        break;
    }

    info(ctx,
         "  - merged constraints removed: {}\n"
         "  - problem memory used: {}\n",
         original_nb - static_cast<int>(ret.size()),
         to_string(memory_consumed_size(memory_consumed(pb))));

    return ret;
}